

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O2

void amrex::EB2::IndexSpace::push(IndexSpace *ispace)

{
  long lVar1;
  long lVar2;
  long in_RDI;
  long *plVar3;
  IndexSpace *local_8;
  
  lVar1 = (long)DAT_006e1ab0 - (long)m_instance;
  plVar3 = m_instance;
  for (lVar2 = lVar1 >> 5; 0 < lVar2; lVar2 = lVar2 + -1) {
    if (*plVar3 == in_RDI) goto LAB_004acf3f;
    if (plVar3[1] == in_RDI) {
      plVar3 = plVar3 + 1;
      goto LAB_004acf3f;
    }
    if (plVar3[2] == in_RDI) {
      plVar3 = plVar3 + 2;
      goto LAB_004acf3f;
    }
    if (plVar3[3] == in_RDI) {
      plVar3 = plVar3 + 3;
      goto LAB_004acf3f;
    }
    plVar3 = plVar3 + 4;
    lVar1 = lVar1 + -0x20;
  }
  lVar1 = lVar1 >> 3;
  if (lVar1 == 1) {
LAB_004acf26:
    if (*plVar3 != in_RDI) {
      plVar3 = DAT_006e1ab0;
    }
  }
  else if (lVar1 == 2) {
LAB_004acf1d:
    if (*plVar3 != in_RDI) {
      plVar3 = plVar3 + 1;
      goto LAB_004acf26;
    }
  }
  else {
    if (lVar1 != 3) goto LAB_004acf53;
    if (*plVar3 != in_RDI) {
      plVar3 = plVar3 + 1;
      goto LAB_004acf1d;
    }
  }
LAB_004acf3f:
  if (plVar3 != DAT_006e1ab0) {
    if (plVar3 + 1 == DAT_006e1ab0) {
      return;
    }
    std::_V2::
    __rotate<__gnu_cxx::__normal_iterator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>*,std::vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>>>
              ();
    return;
  }
LAB_004acf53:
  std::
  vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>
  ::emplace_back<amrex::EB2::IndexSpace*&>
            ((vector<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>,std::allocator<std::unique_ptr<amrex::EB2::IndexSpace,std::default_delete<amrex::EB2::IndexSpace>>>>
              *)&m_instance,&local_8);
  return;
}

Assistant:

void
IndexSpace::push (IndexSpace* ispace)
{
    auto r = std::find_if(m_instance.begin(), m_instance.end(),
                          [=] (const std::unique_ptr<IndexSpace>& x) -> bool
                          { return x.get() == ispace; });
    if (r == m_instance.end()) {
        m_instance.emplace_back(ispace);
    } else if (r+1 != m_instance.end()) {
        std::rotate(r, r+1, m_instance.end());
    }
}